

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

ForNonEnum<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>,_std::string>
* __thiscall
lest::make_enum_string<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>>
          (ForNonEnum<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>,_std::string>
           *__return_storage_ptr__,lest *this,
          unexpected_type<std::__exception_ptr::exception_ptr> *item)

{
  unexpected_type<std::__exception_ptr::exception_ptr> *item_00;
  allocator local_b9;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,"[type: ",&local_b9);
  std::operator+(&local_98,&local_38,
                 "N6nonstd13expected_lite15unexpected_typeINSt15__exception_ptr13exception_ptrEEE");
  std::operator+(&local_78,&local_98,"]: ");
  make_memory_string<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>>
            (&local_b8,this,item_00);
  std::operator+(&local_58,&local_78,&local_b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_58.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_58._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

auto make_enum_string( T const & item ) -> ForNonEnum<T, std::string>
{
#if lest__cpp_rtti
    return text("[type: ") + typeid(T).name() + "]: " + make_memory_string( item );
#else
    return text("[type: (no RTTI)]: ") + make_memory_string( item );
#endif
}